

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJReader.cc
# Opt level: O3

void __thiscall OpenMesh::IO::_OBJReader_::_OBJReader_(_OBJReader_ *this)

{
  _Rb_tree_header *p_Var1;
  _IOManager_ *this_00;
  _OBJReader_ *local_28;
  
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OBJReader__001c2020;
  p_Var1 = &(this->materials_)._M_t._M_impl.super__Rb_tree_header;
  (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  this_00 = IOManager();
  local_28 = this;
  std::
  _Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
  ::_M_insert_unique<OpenMesh::IO::BaseReader*const&>
            ((_Rb_tree<OpenMesh::IO::BaseReader*,OpenMesh::IO::BaseReader*,std::_Identity<OpenMesh::IO::BaseReader*>,std::less<OpenMesh::IO::BaseReader*>,std::allocator<OpenMesh::IO::BaseReader*>>
              *)this_00,(BaseReader **)&local_28);
  _IOManager_::update_read_filters(this_00);
  return;
}

Assistant:

_OBJReader_::
_OBJReader_()
{
  IOManager().register_module(this);
}